

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O3

void CB_ADF::do_actual_learning<true>(cb_adf *data,multi_learner *base,multi_ex *ec_seq)

{
  bool bVar1;
  vw_exception *this;
  uint64_t offset;
  cb_class cVar2;
  stringstream __msg;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8;
  
  data->offset = ((*(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                    super__Vector_impl_data._M_start)->super_example_predict).ft_offset;
  cVar2 = get_observed_cost(ec_seq);
  (data->gen_cs).known_cost = cVar2;
  bVar1 = test_adf_sequence(ec_seq);
  if (bVar1) {
    GEN_CS::gen_cs_test_example(ec_seq,&data->cs_labels);
    GEN_CS::call_cs_ldf<false>
              (base,ec_seq,&data->cb_labels,&data->cs_labels,&data->prepped_cs_labels,data->offset,0
              );
    return;
  }
  switch((data->gen_cs).cb_type) {
  case 0:
    GEN_CS::gen_cs_example_dr<true>(&data->gen_cs,ec_seq,&data->cs_labels);
    offset = data->offset;
    goto LAB_0024ab66;
  case 1:
    GEN_CS::gen_cs_example_dm(ec_seq,&data->cs_labels);
    break;
  case 2:
    GEN_CS::gen_cs_example_ips(ec_seq,&data->cs_labels);
    break;
  case 3:
    if (data->no_predict == true) {
      learn_MTR<false>(data,base,ec_seq);
      return;
    }
    learn_MTR<true>(data,base,ec_seq);
    return;
  default:
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (&local_1a8,"Unknown cb_type specified for contextual bandit learning: ",0x3a);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
    this = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (this,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cb_adf.cc"
               ,0xb1,&local_1d8);
    __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  offset = data->offset;
LAB_0024ab66:
  GEN_CS::call_cs_ldf<true>
            (base,ec_seq,&data->cb_labels,&data->cs_labels,&data->prepped_cs_labels,offset,0);
  return;
}

Assistant:

void do_actual_learning(cb_adf& data, multi_learner& base, multi_ex& ec_seq)
{
  data.offset = ec_seq[0]->ft_offset;
  data.gen_cs.known_cost = get_observed_cost(ec_seq);  // need to set for test case
  if (is_learn && !test_adf_sequence(ec_seq))
  {
    /*	v_array<float> temp_scores;
    temp_scores = v_init<float>();
    do_actual_learning<false>(data,base);
    for (size_t i = 0; i < data.ec_seq[0]->pred.a_s.size(); i++)
    temp_scores.push_back(data.ec_seq[0]->pred.a_s[i].score);*/
    switch (data.gen_cs.cb_type)
    {
      case CB_TYPE_IPS:
        learn_IPS(data, base, ec_seq);
        break;
      case CB_TYPE_DR:
        learn_DR(data, base, ec_seq);
        break;
      case CB_TYPE_DM:
        learn_DM(data, base, ec_seq);
        break;
      case CB_TYPE_MTR:
        if (data.no_predict)
          learn_MTR<false>(data, base, ec_seq);
        else
          learn_MTR<true>(data, base, ec_seq);
        break;
      default:
        THROW("Unknown cb_type specified for contextual bandit learning: " << data.gen_cs.cb_type);
    }

    /*      for (size_t i = 0; i < temp_scores.size(); i++)
    if (temp_scores[i] != data.ec_seq[0]->pred.a_s[i].score)
      cout << "problem! " << temp_scores[i] << " != " << data.ec_seq[0]->pred.a_s[i].score << " for " <<
    data.ec_seq[0]->pred.a_s[i].action << endl; temp_scores.delete_v();*/
  }
  else
  {
    gen_cs_test_example(ec_seq, data.cs_labels);  // create test labels.
    call_cs_ldf<false>(base, ec_seq, data.cb_labels, data.cs_labels, data.prepped_cs_labels, data.offset);
  }
}